

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovContext.cpp
# Opt level: O0

void __thiscall
cov::Context::Context(Context *this,Device *device,contextCallback pfnNotify,void *userData)

{
  int iVar1;
  bool local_a1;
  undefined4 local_a0 [2];
  VkDeviceCreateInfo deviceCreateInfo;
  undefined4 local_50;
  float priority;
  VkDeviceQueueCreateInfo queueCreateInfo;
  void *userData_local;
  contextCallback pfnNotify_local;
  Device *device_local;
  Context *this_local;
  
  queueCreateInfo.pQueuePriorities = (float *)userData;
  ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>::ClObject
            (&this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>);
  this->m_device = device;
  this->m_callback = pfnNotify;
  this->m_userData = queueCreateInfo.pQueuePriorities;
  this->m_vkDevice = (VkDevice)0x0;
  this->m_vkQueue = (VkQueue)0x0;
  memset(&local_50,0,0x28);
  local_50 = 2;
  queueCreateInfo.pNext._4_4_ = this->m_device->m_vkQueueFamilyIndex;
  queueCreateInfo.flags = 1;
  deviceCreateInfo.pEnabledFeatures._4_4_ = 0x3f800000;
  queueCreateInfo._24_8_ = (long)&deviceCreateInfo.pEnabledFeatures + 4;
  memset(local_a0,0,0x48);
  local_a0[0] = 3;
  deviceCreateInfo.pNext._4_4_ = 1;
  deviceCreateInfo._16_8_ = &local_50;
  local_a1 = false;
  if (((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess & 1U) != 0) {
    iVar1 = vkCreateDevice(this->m_device->m_vkPhysicalDevice,local_a0,0,&this->m_vkDevice);
    local_a1 = iVar1 == 0;
  }
  (this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess = local_a1;
  if (((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess & 1U) == 0) {
    (*this->m_callback)("failed to create context!",(void *)0x0,0,this->m_userData);
  }
  else {
    vkGetDeviceQueue(this->m_vkDevice,this->m_device->m_vkQueueFamilyIndex,0,&this->m_vkQueue);
  }
  return;
}

Assistant:

Context::Context(const Device& device, contextCallback pfnNotify, void* userData)
    : ClObject(),
      m_device(device),
      m_callback(pfnNotify),
      m_userData(userData),
      m_vkDevice(VK_NULL_HANDLE),
      m_vkQueue(VK_NULL_HANDLE)
{
    VkDeviceQueueCreateInfo queueCreateInfo{};
    queueCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
    queueCreateInfo.queueFamilyIndex = m_device.m_vkQueueFamilyIndex;
    queueCreateInfo.queueCount = 1;
    const float priority = 1.0f;
    queueCreateInfo.pQueuePriorities = &priority;

    VkDeviceCreateInfo deviceCreateInfo{};
    deviceCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    deviceCreateInfo.queueCreateInfoCount = 1;
    deviceCreateInfo.pQueueCreateInfos = &queueCreateInfo;
    m_initSuccess = m_initSuccess &&
        vkCreateDevice(m_device.m_vkPhysicalDevice, &deviceCreateInfo, nullptr, &m_vkDevice) == VK_SUCCESS;

    if (m_initSuccess) {
        vkGetDeviceQueue(m_vkDevice, m_device.m_vkQueueFamilyIndex, 0, &m_vkQueue);
    } else {
        m_callback("failed to create context!", nullptr, 0, m_userData);
    }
}